

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairingHeap.h
# Opt level: O0

Node * PairingHeap<std::pair<double,_int>_>::backJoin(Node *pre,Node *cur)

{
  bool bVar1;
  Node *in_RSI;
  Node *in_RDI;
  Node *local_8;
  
  bVar1 = std::operator<(&in_RSI->key,&in_RDI->key);
  if (bVar1) {
    in_RSI->porp = in_RDI->porp;
    makeChildOf(in_RDI,in_RSI);
    local_8 = in_RSI;
  }
  else {
    in_RDI->next = (Node *)0x0;
    makeChildOf(in_RSI,in_RDI);
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

static Node *backJoin(Node *pre, Node *cur)
	{
		if (cur->key < pre->key)
		{
			cur->porp = pre->porp;
			makeChildOf(pre, cur);
			return cur;
		}
		pre->next = nullptr;
		makeChildOf(cur, pre);
		return pre;
	}